

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,REF_INT node)

{
  uint uVar1;
  long lVar3;
  long lVar4;
  REF_INT nodes [27];
  uint local_a8 [30];
  REF_ADJ pRVar2;
  
  uVar1 = printf("node %d\n");
  pRVar2 = (REF_ADJ)(ulong)uVar1;
  if (((-1 < node) && (pRVar2 = ref_cell->ref_adj, node < pRVar2->nnode)) &&
     (lVar4 = (long)pRVar2->first[(uint)node], lVar4 != -1)) {
    uVar1 = pRVar2->item[lVar4].ref;
    printf("cell %d:",(ulong)uVar1);
    for (uVar1 = ref_cell_nodes(ref_cell,uVar1,(REF_INT *)local_a8); uVar1 == 0;
        uVar1 = ref_cell_nodes(ref_cell,uVar1,(REF_INT *)local_a8)) {
      if (0 < ref_cell->node_per) {
        lVar3 = 0;
        do {
          printf(" %d",(ulong)local_a8[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < ref_cell->node_per);
      }
      putchar(10);
      pRVar2 = (REF_ADJ)ref_cell->ref_adj->item;
      lVar4 = (long)(&pRVar2->nnode)[(long)(int)lVar4 * 2];
      if (lVar4 == -1) goto LAB_001e26ba;
      uVar1 = (&pRVar2->nitem)[lVar4 * 2];
      printf("cell %d:",(ulong)uVar1);
    }
    uVar1 = printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xde,"ref_validation_node_cell",(ulong)uVar1,"get cell");
    pRVar2 = (REF_ADJ)(ulong)uVar1;
  }
LAB_001e26ba:
  return (REF_STATUS)pRVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,
                                                   REF_INT node) {
  REF_INT item, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  printf("node %d\n", node);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    printf("cell %d:", cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      printf(" %d", nodes[cell_node]);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}